

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O3

void __thiscall
MipTimer::csvMipClockList
          (MipTimer *this,string *grep_query,string *model_name,
          vector<int,_std::allocator<int>_> *mip_clock_list,HighsTimerClock *mip_timer_clock,
          HighsInt kMipClockIdeal,bool header,bool end_line)

{
  double dVar1;
  HighsTimer *this_00;
  pointer pcVar2;
  pointer __nbytes;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  ulong uVar3;
  uint uVar4;
  double extraout_XMM0_Qa;
  double local_40;
  
  this_00 = mip_timer_clock->timer_pointer_;
  dVar1 = (this_00->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start
          [(mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[kMipClockIdeal]];
  if (0.01 <= dVar1) {
    pcVar2 = (grep_query->_M_dataplus)._M_p;
    uVar4 = (uint)((ulong)((long)(mip_clock_list->super__Vector_base<int,_std::allocator<int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(mip_clock_list->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
    if (header) {
      printf("grep_%s,model,ideal",pcVar2);
      if (0 < (int)uVar4) {
        uVar3 = 0;
        do {
          printf(",%s",(this_00->clock_names).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [(mip_clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar3]]]._M_dataplus._M_p);
          uVar3 = uVar3 + 1;
        } while ((uVar4 & 0x7fffffff) != uVar3);
      }
      printf(",Unaccounted");
    }
    else {
      printf("grep_%s,%s,%11.4g",pcVar2,(model_name->_M_dataplus)._M_p);
      if ((int)uVar4 < 1) {
        local_40 = 0.0;
      }
      else {
        local_40 = 0.0;
        uVar3 = 0;
        __buf = extraout_RDX;
        do {
          __nbytes = (mip_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     .super__Vector_impl_data._M_start;
          HighsTimer::read(this_00,__nbytes[(mip_clock_list->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_start[uVar3]],__buf,
                           (size_t)__nbytes);
          local_40 = local_40 + extraout_XMM0_Qa;
          printf(",%11.4g");
          uVar3 = uVar3 + 1;
          __buf = extraout_RDX_00;
        } while ((uVar4 & 0x7fffffff) != uVar3);
      }
      printf(",%11.4g",dVar1 - local_40);
    }
    if (end_line) {
      putchar(10);
      return;
    }
  }
  return;
}

Assistant:

void csvMipClockList(const std::string grep_query,
                       const std::string model_name,
                       const std::vector<HighsInt> mip_clock_list,
                       const HighsTimerClock& mip_timer_clock,
                       const HighsInt kMipClockIdeal, const bool header,
                       const bool end_line) {
    HighsTimer* timer_pointer = mip_timer_clock.timer_pointer_;
    const std::vector<HighsInt>& clock = mip_timer_clock.clock_;
    const double ideal_sum_time =
        timer_pointer->clock_time[clock[kMipClockIdeal]];
    if (ideal_sum_time < 1e-2) return;
    const HighsInt num_clock = mip_clock_list.size();
    if (header) {
      printf("grep_%s,model,ideal", grep_query.c_str());
      for (HighsInt iX = 0; iX < num_clock; iX++) {
        HighsInt iclock = clock[mip_clock_list[iX]];
        printf(",%s", timer_pointer->clock_names[iclock].c_str());
      }
      printf(",Unaccounted");
      if (end_line) printf("\n");
      return;
    }
    double sum_time = 0;
    printf("grep_%s,%s,%11.4g", grep_query.c_str(), model_name.c_str(),
           ideal_sum_time);
    for (HighsInt iX = 0; iX < num_clock; iX++) {
      HighsInt iclock = clock[mip_clock_list[iX]];
      double time = timer_pointer->read(iclock);
      sum_time += time;
      printf(",%11.4g", time);
    }
    printf(",%11.4g", ideal_sum_time - sum_time);
    if (end_line) printf("\n");
  }